

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall HighsOptionsStruct::~HighsOptionsStruct(HighsOptionsStruct *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__HighsOptionsStruct_001b6550;
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x162e6d);
  std::__cxx11::string::~string((string *)(in_RDI + 0x6b));
  std::__cxx11::string::~string((string *)(in_RDI + 0x59));
  std::__cxx11::string::~string((string *)(in_RDI + 0x37));
  std::__cxx11::string::~string((string *)(in_RDI + 0x31));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1b));
  std::__cxx11::string::~string((string *)(in_RDI + 0x16));
  std::__cxx11::string::~string((string *)(in_RDI + 0x12));
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~HighsOptionsStruct() {}